

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O1

Action __thiscall
psy::C::SyntaxDumper::visitForStatement(SyntaxDumper *this,ForStatementSyntax *node)

{
  SyntaxToken local_50;
  
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->forKwTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->openParenTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->extKwTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->initStmt_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->cond_);
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->semicolonTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->expr_);
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->closeParenTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->stmt_);
  return Skip;
}

Assistant:

virtual Action visitForStatement(const ForStatementSyntax* node) override
    {
        terminal(node->forKeyword(), node);
        terminal(node->openParenthesisToken(), node);
        terminal(node->extensionKeyword(), node);
        nonterminal(node->initializer());
        nonterminal(node->condition());
        terminal(node->semicolonToken(), node);
        nonterminal(node->expression());
        terminal(node->closeParenthesisToken(), node);
        nonterminal(node->statement());
        return Action::Skip;
    }